

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O0

vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
obj::load_from_stream<float>
          (vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
           *__return_storage_ptr__,istream *is)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  size_type sVar5;
  reference pvVar6;
  ulong local_4e0;
  undefined1 local_49c [8];
  value_type v;
  size_t j;
  optional<int> index;
  size_t i;
  Vec<float,_3UL> points [2];
  float local_458;
  float z;
  float y;
  float x;
  char *ptr;
  undefined1 local_431;
  undefined1 local_430 [8];
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> vertices;
  char line [1024];
  istream *is_local;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *triangles;
  
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            ((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_430);
  local_431 = 0;
  std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::vector
            (__return_storage_ptr__);
  do {
    do {
      while( true ) {
        do {
          plVar3 = (long *)std::istream::getline
                                     ((char *)is,
                                      (long)&vertices.
                                             super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
          if (!bVar1) {
            local_431 = 1;
            std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::
            ~vector((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
                    local_430);
            return __return_storage_ptr__;
          }
          _y = strip_spaces((char *)&vertices.
                                     super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        } while ((*_y == '\0') || (*_y == '#'));
        remove_eol(_y);
        if ((*_y != 'v') || (iVar2 = isspace((int)_y[1]), iVar2 == 0)) break;
        z = strtof(_y + 1,(char **)&y);
        local_458 = strtof(_y,(char **)&y);
        points[1].values[2] = strtof(_y,(char **)&y);
        std::vector<bvh::v2::Vec<float,3ul>,std::allocator<bvh::v2::Vec<float,3ul>>>::
        emplace_back<float&,float&,float&>
                  ((vector<bvh::v2::Vec<float,3ul>,std::allocator<bvh::v2::Vec<float,3ul>>> *)
                   local_430,&z,&local_458,points[1].values + 2);
      }
    } while ((*_y != 'f') || (iVar2 = isspace((int)_y[1]), iVar2 == 0));
    _y = _y + 2;
    index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
         (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
    while( true ) {
      j = (size_t)read_index((char **)&y);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&j);
      if (!bVar1) break;
      piVar4 = std::optional<int>::operator*((optional<int> *)&j);
      if (*piVar4 < 0) {
        sVar5 = std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::
                size((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *
                     )local_430);
        piVar4 = std::optional<int>::operator*((optional<int> *)&j);
        local_4e0 = sVar5 + (long)*piVar4;
      }
      else {
        piVar4 = std::optional<int>::operator*((optional<int> *)&j);
        local_4e0 = (ulong)(*piVar4 + -1);
      }
      v.values[1] = (float)(undefined4)local_4e0;
      v.values[2] = (float)local_4e0._4_4_;
      sVar5 = std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::
              size((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
                   local_430);
      if (sVar5 <= local_4e0) {
        __assert_fail("j < vertices.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/test/load_obj.cpp"
                      ,0x50,
                      "std::vector<Tri<T, 3>> obj::load_from_stream(std::istream &) [T = float]");
      }
      pvVar6 = std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                           *)local_430,v.values._4_8_);
      local_49c = *(undefined1 (*) [8])pvVar6->values;
      v.values[0] = pvVar6->values[2];
      if ((ulong)index.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> < 2) {
        *(undefined1 (*) [8])
         (points[(long)index.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int> + -1].values + 1) = local_49c;
        points[(long)index.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>].values[0] = v.values[0];
      }
      else {
        std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
        emplace_back<bvh::v2::Vec<float,3ul>&,bvh::v2::Vec<float,3ul>&,bvh::v2::Vec<float,3ul>&>
                  ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)
                   __return_storage_ptr__,(Vec<float,_3UL> *)&i,
                   (Vec<float,_3UL> *)(points[0].values + 1),(Vec<float,_3UL> *)local_49c);
        points[0].values[1] = (float)local_49c._0_4_;
        points[0].values[2] = (float)local_49c._4_4_;
        points[1].values[0] = v.values[0];
      }
      index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
           (_Optional_base<int,_true,_true>)
           ((long)index.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> + 1);
    }
  } while( true );
}

Assistant:

inline std::vector<Tri<T, 3>> load_from_stream(std::istream& is) {
    static constexpr size_t max_line = 1024;
    char line[max_line];

    std::vector<Vec<T, 3>> vertices;
    std::vector<Tri<T, 3>> triangles;

    while (is.getline(line, max_line)) {
        char* ptr = strip_spaces(line);
        if (*ptr == '\0' || *ptr == '#')
            continue;
        remove_eol(ptr);
        if (*ptr == 'v' && std::isspace(ptr[1])) {
            auto x = std::strtof(ptr + 1, &ptr);
            auto y = std::strtof(ptr, &ptr);
            auto z = std::strtof(ptr, &ptr);
            vertices.emplace_back(x, y, z);
        } else if (*ptr == 'f' && std::isspace(ptr[1])) {
            Vec<T, 3> points[2];
            ptr += 2;
            for (size_t i = 0; ; ++i) {
                if (auto index = read_index(&ptr)) {
                    size_t j = *index < 0 ? vertices.size() + *index : *index - 1;
                    assert(j < vertices.size());
                    auto v = vertices[j];
                    if (i >= 2) {
                        triangles.emplace_back(points[0], points[1], v);
                        points[1] = v;
                    } else {
                        points[i] = v;
                    }
                } else {
                    break;
                }
            }
        }
    }

    return triangles;
}